

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                   (string *__return_storage_ptr__,char (*a) [34],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [45],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [2],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_2c8;
  cmAlphaNum local_290;
  cmAlphaNum local_258;
  cmAlphaNum local_220;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b0;
  cmAlphaNum local_178;
  cmAlphaNum local_140;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [14];
  char (*args_local_2) [14];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [45];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  char (*a_local) [34];
  
  local_38 = args_2;
  args_local_2 = (char (*) [14])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [45])b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (char (*) [34])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_140,*a);
  cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_108,
             &cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&)
              ::makePair,&local_140);
  cmAlphaNum::cmAlphaNum(&local_178,(string *)args_local);
  cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_f0,
             &cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&)
              ::makePair,&local_178);
  cmAlphaNum::cmAlphaNum(&local_1b0,(char *)args_local_1);
  cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&)
              ::makePair,&local_1b0);
  cmAlphaNum::cmAlphaNum(&local_1e8,(string *)args_local_2);
  cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&)
              ::makePair,&local_1e8);
  cmAlphaNum::cmAlphaNum(&local_220,*local_38);
  cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&)
              ::makePair,&local_220);
  cmAlphaNum::cmAlphaNum(&local_258,args_3);
  cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&)
              ::makePair,&local_258);
  cmAlphaNum::cmAlphaNum(&local_290,*args_4);
  cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&)
              ::makePair,&local_290);
  cmAlphaNum::cmAlphaNum(&local_2c8,args_5);
  cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[34],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>(char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string&)
              ::makePair,&local_2c8);
  local_48 = &local_108;
  local_40 = 8;
  views._M_len = 8;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}